

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.hpp
# Opt level: O2

bool duckdb_httplib::detail::read_content_with_length
               (Stream *strm,uint64_t len,Progress *progress,ContentReceiverWithProgress *out)

{
  bool bVar1;
  int iVar2;
  int extraout_var;
  ulong uVar3;
  ulong __args_2;
  char buf [4096];
  char local_1038 [4104];
  unsigned_long __args_1;
  
  uVar3 = 0;
  do {
    do {
      __args_2 = uVar3;
      uVar3 = len - __args_2;
      if (len < __args_2 || uVar3 == 0) goto LAB_0041beef;
      if (0xfff < uVar3) {
        uVar3 = 0x1000;
      }
      iVar2 = (*strm->_vptr_Stream[4])(strm,local_1038,uVar3);
      __args_1 = CONCAT44(extraout_var,iVar2);
      if (__args_1 == 0 || extraout_var < 0) goto LAB_0041beef;
      bVar1 = std::function<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long)>::
              operator()(out,local_1038,__args_1,__args_2,len);
      if (!bVar1) goto LAB_0041beef;
      uVar3 = __args_1 + __args_2;
    } while ((progress->super__Function_base)._M_manager == (_Manager_type)0x0);
    bVar1 = std::function<bool_(unsigned_long,_unsigned_long)>::operator()(progress,uVar3,len);
  } while (bVar1);
LAB_0041beef:
  return len <= __args_2;
}

Assistant:

inline bool read_content_with_length(Stream &strm, uint64_t len,
                                     Progress progress,
                                     ContentReceiverWithProgress out) {
  char buf[CPPHTTPLIB_RECV_BUFSIZ];

  uint64_t r = 0;
  while (r < len) {
    auto read_len = static_cast<size_t>(len - r);
    auto n = strm.read(buf, (std::min)(read_len, CPPHTTPLIB_RECV_BUFSIZ));
    if (n <= 0) { return false; }

    if (!out(buf, static_cast<size_t>(n), r, len)) { return false; }
    r += static_cast<uint64_t>(n);

    if (progress) {
      if (!progress(r, len)) { return false; }
    }
  }

  return true;
}